

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::PskcTest_PskcTestVectorFromThread12Spec_Test::
~PskcTest_PskcTestVectorFromThread12Spec_Test(PskcTest_PskcTestVectorFromThread12Spec_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PskcTest, PskcTestVectorFromThread12Spec)
{
    const std::string passphrase    = "12SECRETPASSWORD34";
    const std::string networkName   = "Test Network";
    const ByteArray   extendedPanId = {0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07};
    ByteArray         pskc;

    EXPECT_EQ(Commissioner::GeneratePSKc(pskc, passphrase, networkName, extendedPanId), ErrorCode::kNone);
    EXPECT_EQ(pskc.size(), kMaxPSKcLength);
    EXPECT_EQ(utils::Hex(pskc), "c3f59368445a1b6106be420a706d4cc9");
}